

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O0

int __thiscall mognetwork::TcpASIOServer::init(TcpASIOServer *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TcpASIOListener *pTVar1;
  TcpASIOWriter *pTVar2;
  TcpASIOServer *in_stack_00000008;
  TcpASIOWriter *in_stack_00000010;
  TcpASIOServer *in_stack_00000018;
  TcpASIOListener *in_stack_00000020;
  
  pTVar1 = (TcpASIOListener *)operator_new(0x1f0);
  TcpASIOListener::TcpASIOListener(in_stack_00000020,in_stack_00000018);
  this->m_serverListener = pTVar1;
  pTVar2 = (TcpASIOWriter *)operator_new(0x220);
  TcpASIOWriter::TcpASIOWriter(in_stack_00000010,in_stack_00000008);
  this->m_serverWriter = pTVar2;
  TcpASIOListener::setProtocolFactory(this->m_serverListener,this->m_protocolFactory);
  return extraout_EAX;
}

Assistant:

void TcpASIOServer::init()
  {
	  m_serverListener = new TcpASIOListener(this);
	  m_serverWriter = new TcpASIOWriter(this);
	  m_serverListener->setProtocolFactory(m_protocolFactory);
  }